

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O1

ssize_t __thiscall
zmq::detail::socket_base::send(socket_base *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  error_t *this_00;
  undefined4 in_register_00000034;
  undefined8 uVar3;
  
  iVar1 = zmq_msg_send((zmq_msg_t *)CONCAT44(in_register_00000034,__fd),this->_handle,(int)__buf);
  uVar3 = CONCAT44(extraout_var,iVar1);
  if (iVar1 < 0) {
    iVar2 = zmq_errno();
    uVar3 = CONCAT44(extraout_var_00,iVar2);
    if (iVar2 != 0xb) {
      this_00 = (error_t *)__cxa_allocate_exception(0x10);
      error_t::error_t(this_00);
      __cxa_throw(this_00,&error_t::typeinfo,std::exception::~exception);
    }
  }
  return CONCAT71((int7)((ulong)uVar3 >> 8),-1 < iVar1);
}

Assistant:

bool send(message_t &msg_,
              int flags_ = 0) // default until removed
    {
        int nbytes = zmq_msg_send(msg_.handle(), _handle, flags_);
        if (nbytes >= 0)
            return true;
        if (zmq_errno() == EAGAIN)
            return false;
        throw error_t();
    }